

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringAlgorithms.h
# Opt level: O1

string * cmStrCat<char_const(&)[30],bool,char_const(&)[2],char_const(&)[42],bool,char_const(&)[2],char_const(&)[43],bool,char_const(&)[2],char_const(&)[37],bool,char_const(&)[2],char_const(&)[34],bool,char_const(&)[2]>
                   (string *__return_storage_ptr__,char (*a) [30],bool *b,char (*args) [2],
                   char (*args_1) [42],bool *args_2,char (*args_3) [2],char (*args_4) [43],
                   bool *args_5,char (*args_6) [2],char (*args_7) [37],bool *args_8,
                   char (*args_9) [2],char (*args_10) [34],bool *args_11,char (*args_12) [2])

{
  cmAlphaNum *pcVar1;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  undefined1 local_2b0 [56];
  undefined1 local_278 [56];
  undefined1 local_240 [56];
  undefined1 local_208 [56];
  undefined1 local_1d0 [56];
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_198;
  size_t local_180;
  string *local_178;
  cmAlphaNum *local_170;
  size_t local_168;
  char (*local_160) [2];
  undefined8 local_158;
  size_t local_150;
  char (*local_148) [42];
  undefined8 local_140;
  size_t local_138;
  string *local_130;
  cmAlphaNum *local_128;
  size_t local_120;
  char (*local_118) [2];
  undefined8 local_110;
  size_t local_108;
  char (*local_100) [43];
  undefined8 local_f8;
  size_t local_f0;
  string *local_e8;
  cmAlphaNum *local_e0;
  size_t local_d8;
  char (*local_d0) [2];
  undefined8 local_c8;
  size_t local_c0;
  char (*local_b8) [37];
  undefined8 local_b0;
  size_t local_a8;
  string *local_a0;
  cmAlphaNum *local_98;
  size_t local_90;
  char (*local_88) [2];
  undefined8 local_80;
  size_t local_78;
  char (*local_70) [34];
  undefined8 local_68;
  size_t local_60;
  string *local_58;
  cmAlphaNum *local_50;
  size_t local_48;
  char (*local_40) [2];
  undefined8 local_38;
  
  local_198.first._M_len = strlen(*a);
  local_198.second = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_198.first._M_str = *a;
  cmAlphaNum::cmAlphaNum((cmAlphaNum *)local_1d0,(uint)*b);
  pcVar1 = (cmAlphaNum *)(local_1d0 + 0x10);
  if ((cmAlphaNum *)local_1d0._0_8_ != (cmAlphaNum *)0x0) {
    pcVar1 = (cmAlphaNum *)local_1d0._0_8_;
  }
  local_178 = pcVar1->RValueString_;
  pcVar1 = (cmAlphaNum *)local_1d0;
  if ((cmAlphaNum *)local_1d0._0_8_ != (cmAlphaNum *)0x0) {
    pcVar1 = (cmAlphaNum *)local_1d0._0_8_;
  }
  local_180 = (pcVar1->View_)._M_len;
  local_170 = (cmAlphaNum *)local_1d0._0_8_;
  local_168 = strlen(*args);
  local_158 = 0;
  local_160 = args;
  local_150 = strlen(*args_1);
  local_140 = 0;
  local_148 = args_1;
  cmAlphaNum::cmAlphaNum((cmAlphaNum *)local_208,(uint)*args_2);
  pcVar1 = (cmAlphaNum *)(local_208 + 0x10);
  if ((cmAlphaNum *)local_208._0_8_ != (cmAlphaNum *)0x0) {
    pcVar1 = (cmAlphaNum *)local_208._0_8_;
  }
  local_130 = pcVar1->RValueString_;
  pcVar1 = (cmAlphaNum *)local_208;
  if ((cmAlphaNum *)local_208._0_8_ != (cmAlphaNum *)0x0) {
    pcVar1 = (cmAlphaNum *)local_208._0_8_;
  }
  local_138 = (pcVar1->View_)._M_len;
  local_128 = (cmAlphaNum *)local_208._0_8_;
  local_120 = strlen(*args_3);
  local_118 = args_3;
  local_110 = 0;
  local_108 = strlen(*args_4);
  local_100 = args_4;
  local_f8 = 0;
  cmAlphaNum::cmAlphaNum((cmAlphaNum *)local_240,(uint)*args_5);
  pcVar1 = (cmAlphaNum *)(local_240 + 0x10);
  if ((cmAlphaNum *)local_240._0_8_ != (cmAlphaNum *)0x0) {
    pcVar1 = (cmAlphaNum *)local_240._0_8_;
  }
  local_e8 = pcVar1->RValueString_;
  pcVar1 = (cmAlphaNum *)local_240;
  if ((cmAlphaNum *)local_240._0_8_ != (cmAlphaNum *)0x0) {
    pcVar1 = (cmAlphaNum *)local_240._0_8_;
  }
  local_f0 = (pcVar1->View_)._M_len;
  local_e0 = (cmAlphaNum *)local_240._0_8_;
  local_d8 = strlen(*args_6);
  local_d0 = args_6;
  local_c8 = 0;
  local_c0 = strlen(*args_7);
  local_b8 = args_7;
  local_b0 = 0;
  cmAlphaNum::cmAlphaNum((cmAlphaNum *)local_278,(uint)*args_8);
  pcVar1 = (cmAlphaNum *)(local_278 + 0x10);
  if ((cmAlphaNum *)local_278._0_8_ != (cmAlphaNum *)0x0) {
    pcVar1 = (cmAlphaNum *)local_278._0_8_;
  }
  local_a0 = pcVar1->RValueString_;
  pcVar1 = (cmAlphaNum *)local_278;
  if ((cmAlphaNum *)local_278._0_8_ != (cmAlphaNum *)0x0) {
    pcVar1 = (cmAlphaNum *)local_278._0_8_;
  }
  local_a8 = (pcVar1->View_)._M_len;
  local_98 = (cmAlphaNum *)local_278._0_8_;
  local_90 = strlen(*args_9);
  local_88 = args_9;
  local_80 = 0;
  local_78 = strlen(*args_10);
  local_70 = args_10;
  local_68 = 0;
  cmAlphaNum::cmAlphaNum((cmAlphaNum *)local_2b0,(uint)*args_11);
  pcVar1 = (cmAlphaNum *)(local_2b0 + 0x10);
  if ((cmAlphaNum *)local_2b0._0_8_ != (cmAlphaNum *)0x0) {
    pcVar1 = (cmAlphaNum *)local_2b0._0_8_;
  }
  local_58 = pcVar1->RValueString_;
  pcVar1 = (cmAlphaNum *)local_2b0;
  if ((cmAlphaNum *)local_2b0._0_8_ != (cmAlphaNum *)0x0) {
    pcVar1 = (cmAlphaNum *)local_2b0._0_8_;
  }
  local_60 = (pcVar1->View_)._M_len;
  local_50 = (cmAlphaNum *)local_2b0._0_8_;
  local_48 = strlen(*args_12);
  local_40 = args_12;
  local_38 = 0;
  views._M_len = 0xf;
  views._M_array = &local_198;
  cmCatViews(__return_storage_ptr__,views);
  return __return_storage_ptr__;
}

Assistant:

inline std::string cmStrCat(A&& a, B&& b, AV&&... args)
{
  static auto const makePair =
    [](const cmAlphaNum& arg) -> std::pair<cm::string_view, std::string*> {
    return { arg.View(), arg.RValueString() };
  };

  return cmCatViews({ makePair(std::forward<A>(a)),
                      makePair(std::forward<B>(b)),
                      makePair(std::forward<AV>(args))... });
}